

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAnnotationObjectHelper.cc
# Opt level: O2

Rectangle * __thiscall
QPDFAnnotationObjectHelper::getRect
          (Rectangle *__return_storage_ptr__,QPDFAnnotationObjectHelper *this)

{
  allocator<char> local_49;
  undefined1 local_48 [32];
  string local_28 [32];
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_48,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_QPDFObjectHelper).super_BaseHandle);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"/Rect",&local_49);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_48 + 0x10),(string *)local_48);
  QPDFObjectHandle::getArrayAsRectangle
            (__return_storage_ptr__,(QPDFObjectHandle *)(local_48 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x18));
  std::__cxx11::string::~string(local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  return __return_storage_ptr__;
}

Assistant:

QPDFObjectHandle::Rectangle
QPDFAnnotationObjectHelper::getRect()
{
    return oh().getKey("/Rect").getArrayAsRectangle();
}